

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

void __thiscall
Lib::
Map<const_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>_*,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
::expand(Map<const_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>_*,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
         *this)

{
  Entry *__ptr;
  void *placement;
  Entry *pEVar1;
  int iVar2;
  Entry *pEVar3;
  bool bVar4;
  
  iVar2 = 0x20;
  if (this->_capacity != 0) {
    iVar2 = this->_capacity * 2;
  }
  this->_capacity = iVar2;
  __ptr = this->_entries;
  placement = Lib::alloc((long)iVar2 << 5);
  pEVar1 = array_new<Lib::Map<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>const*,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>,Lib::DerefPtrHash<Lib::StlHash>>::Entry>
                     (placement,(long)this->_capacity);
  this->_entries = pEVar1;
  this->_afterLast = pEVar1 + this->_capacity;
  this->_maxEntries = (int)((double)this->_capacity * 0.8);
  iVar2 = this->_noOfEntries;
  this->_noOfEntries = 0;
  pEVar1 = __ptr;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    do {
      pEVar3 = pEVar1;
      pEVar1 = pEVar3 + 1;
    } while (pEVar3->code == 0);
    insert(this,(Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> **)&pEVar3->_key,
           (Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
            *)&(pEVar3->_value).__align,pEVar3->code);
  }
  if (__ptr != (Entry *)0x0) {
    Lib::free(__ptr);
    return;
  }
  return;
}

Assistant:

void expand()
  {
    size_t oldCapacity = _capacity;
    _capacity = _capacity ? _capacity * 2 : 32;

    Entry* oldEntries = _entries;

    void* mem = ALLOC_KNOWN(sizeof(Entry)*_capacity,"Map<>");
    _entries = array_new<Entry>(mem, _capacity);

    _afterLast = _entries + _capacity;
    _maxEntries = (int)(_capacity * 0.8);
    // experiments using (a) random numbers (b) consecutive numbers
    // and (1) int->int 20M allocations (2) string->int 10M allocations
    // and 30,000,000 allocations
    // 0.6 : 6.80 4.87 20.8 14.9 32.6 14
    // 0.7 : 6.58 5.61 23.1 15.2 35.2 16.6
    // 0.8 : 6.36 5.77 24.0 15.4 36.0 17.4
    // 0.9 : 7.54 6.04 25.4 15.2 37.0 18.4
    // copy old entries
    Entry* current = oldEntries;
    int remaining = _noOfEntries;
    _noOfEntries = 0;
    while (remaining != 0) {
      // find first occupied entry
      while (! current->occupied()) {
        current ++;
      }
      // now current is occupied
      insert(std::move(current->key()),std::move(current->value()),current->code);
      current ++;
      remaining --;
    }
    if (oldEntries) {
      array_delete(oldEntries, oldCapacity);
      DEALLOC_KNOWN(oldEntries,sizeof(Entry)*oldCapacity,"Map<>");
    }
  }